

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gme_File.cpp
# Opt level: O2

blargg_err_t __thiscall Gme_File::load_(Gme_File *this,Data_Reader *in)

{
  int iVar1;
  undefined4 extraout_var;
  blargg_err_t pcVar2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar1 = (*in->_vptr_Data_Reader[4])(in);
  pcVar2 = blargg_vector<unsigned_char>::resize(&this->file_data,CONCAT44(extraout_var,iVar1));
  if (pcVar2 == (blargg_err_t)0x0) {
    iVar1 = (*in->_vptr_Data_Reader[3])(in,(this->file_data).begin_,(this->file_data).size_);
    pcVar2 = (blargg_err_t)CONCAT44(extraout_var_00,iVar1);
    if (pcVar2 == (blargg_err_t)0x0) {
      iVar1 = (*this->_vptr_Gme_File[4])(this,(this->file_data).begin_,(this->file_data).size_);
      return (blargg_err_t)CONCAT44(extraout_var_01,iVar1);
    }
  }
  return pcVar2;
}

Assistant:

blargg_err_t Gme_File::load_( Data_Reader& in )
{
	RETURN_ERR( file_data.resize( in.remain() ) );
	RETURN_ERR( in.read( file_data.begin(), (long)file_data.size() ) );
	return load_mem_( file_data.begin(), (long)file_data.size() );
}